

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_one_ech_config
              (ptls_hpke_kem_t **kems,ptls_hpke_cipher_suite_t **ciphers,
              st_decoded_ech_config_t *decoded,uint8_t **src,uint8_t *end)

{
  ushort uVar1;
  ushort *puVar2;
  uint8_t *puVar3;
  ptls_hpke_cipher_suite_t *ppVar4;
  uint8_t *puVar5;
  bool bVar6;
  ptls_hpke_cipher_suite_t **pppVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  char *name;
  ptls_hpke_kem_t *ppVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ptls_hpke_kem_t **pppVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  ushort local_3a;
  
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  puVar17 = *src;
  if (puVar17 == end) {
    iVar8 = 0x32;
  }
  else {
    *src = puVar17 + 1;
    decoded->id = *puVar17;
    puVar2 = (ushort *)*src;
    if ((long)end - (long)puVar2 < 2) {
      iVar8 = 0x32;
    }
    else {
      uVar1 = *puVar2;
      *src = (uint8_t *)(puVar2 + 1);
      ppVar11 = *kems;
      if (ppVar11 != (ptls_hpke_kem_t *)0x0) {
        pppVar16 = kems + 1;
        do {
          if (ppVar11->id == (uint16_t)(uVar1 << 8 | uVar1 >> 8)) {
            decoded->kem = ppVar11;
            break;
          }
          ppVar11 = *pppVar16;
          pppVar16 = pppVar16 + 1;
        } while (ppVar11 != (ptls_hpke_kem_t *)0x0);
      }
      iVar8 = 0x32;
      if ((ulong)((long)end - (long)*src) < 2) {
        bVar21 = false;
      }
      else {
        uVar19 = (long)end - (long)*src;
        lVar13 = -2;
        uVar12 = 0;
        pbVar9 = *src;
        do {
          pbVar10 = pbVar9 + 1;
          *src = pbVar10;
          uVar12 = (ulong)*pbVar9 | uVar12 << 8;
          uVar19 = uVar19 - 1;
          lVar13 = lVar13 + 1;
          pbVar9 = pbVar10;
        } while (lVar13 != 0);
        bVar21 = false;
        if (uVar12 - 1 < uVar19) {
          (decoded->public_key).base = pbVar10;
          (decoded->public_key).len = uVar12;
          *src = pbVar10 + uVar12;
          bVar21 = true;
          iVar8 = 0;
        }
      }
      if (bVar21) {
        iVar8 = 0x32;
        bVar21 = true;
        if (1 < (ulong)((long)end - (long)*src)) {
          puVar3 = *src;
          lVar13 = 0;
          puVar17 = (uint8_t *)0x0;
          do {
            uVar12 = (long)puVar17 * 0x100;
            *src = puVar3 + lVar13 + 1;
            uVar19 = (ulong)puVar3[lVar13];
            puVar17 = (uint8_t *)(uVar12 + uVar19);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 2);
          puVar18 = end + (-2 - (long)puVar3);
          if (puVar17 <= puVar18) {
            uVar12 = uVar12 | uVar19;
            do {
              puVar2 = (ushort *)*src;
              iVar8 = 0x32;
              if (1 < (long)(puVar3 + (uVar12 - (long)puVar2) + 2)) {
                puVar17 = (uint8_t *)(ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
                *src = (uint8_t *)(puVar2 + 1);
                iVar8 = 0;
              }
              bVar21 = true;
              if ((long)(puVar3 + (uVar12 - (long)puVar2) + 2) < 2) {
                bVar6 = false;
              }
              else {
                puVar2 = (ushort *)*src;
                iVar8 = 0x32;
                if (1 < (long)(puVar3 + (uVar12 - (long)puVar2) + 2)) {
                  puVar18 = (uint8_t *)(ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
                  *src = (uint8_t *)(puVar2 + 1);
                  iVar8 = 0;
                }
                if ((long)(puVar3 + (uVar12 - (long)puVar2) + 2) < 2) {
                  bVar6 = false;
                }
                else {
                  bVar6 = true;
                  if (decoded->cipher == (ptls_hpke_cipher_suite_t *)0x0) {
                    ppVar4 = *ciphers;
                    pppVar7 = ciphers + 1;
                    while (ppVar4 != (ptls_hpke_cipher_suite_t *)0x0) {
                      if (((ppVar4->id).kdf == (uint16_t)puVar17) &&
                         ((ppVar4->id).aead == (uint16_t)puVar18)) {
                        decoded->cipher = ppVar4;
                        break;
                      }
                      ppVar4 = *pppVar7;
                      pppVar7 = pppVar7 + 1;
                    }
                  }
                  bVar21 = false;
                  iVar8 = 0;
                }
              }
              if (!bVar6) goto LAB_0011f82f;
            } while (puVar3 + uVar12 + 2 != *src);
            bVar21 = false;
          }
        }
LAB_0011f82f:
        if (!bVar21) {
          if (bVar21) {
            return iVar8;
          }
          puVar17 = *src;
          if (puVar17 != end) {
            *src = puVar17 + 1;
            decoded->max_name_length = *puVar17;
            pbVar9 = *src;
            iVar14 = 0x32;
            if (pbVar9 == end) {
LAB_0011f905:
              bVar21 = false;
              name = (char *)0x0;
            }
            else {
              pbVar10 = pbVar9 + 1;
              *src = pbVar10;
              uVar12 = (ulong)*pbVar9;
              if (((ulong)((long)end - (long)pbVar10) < uVar12) || (uVar12 == 0)) goto LAB_0011f905;
              name = (char *)malloc(uVar12 + 1);
              if (name == (char *)0x0) {
                name = (char *)0x0;
              }
              else {
                memcpy(name,pbVar10,uVar12);
                name[uVar12] = '\0';
              }
              if (name == (char *)0x0) {
                iVar14 = 0x201;
                goto LAB_0011f905;
              }
              iVar8 = ptls_server_name_is_ipaddr(name);
              if (iVar8 == 0) {
                puVar17 = *src;
                (decoded->public_name).base = puVar17;
                (decoded->public_name).len = (long)(pbVar10 + uVar12) - (long)puVar17;
              }
              else {
                decoded->kem = (ptls_hpke_kem_t *)0x0;
                decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
              }
              *src = pbVar10 + uVar12;
              iVar14 = 0;
              bVar21 = true;
            }
            iVar8 = iVar14;
            if (bVar21) {
              bVar21 = true;
              iVar15 = 0x32;
              if (1 < (ulong)((long)end - (long)*src)) {
                puVar3 = *src;
                lVar13 = 0;
                puVar17 = (uint8_t *)0x0;
                puVar18 = puVar3;
                do {
                  uVar12 = (long)puVar17 * 0x100;
                  *src = puVar3 + lVar13 + 1;
                  pbVar9 = puVar3 + lVar13;
                  puVar17 = (uint8_t *)(uVar12 + *pbVar9);
                  puVar18 = puVar18 + 1;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 2);
                if (puVar17 <= end + (-2 - (long)puVar3)) {
                  uVar12 = uVar12 | *pbVar9;
                  puVar2 = (ushort *)*src;
                  while (puVar2 < puVar3 + uVar12 + 2) {
                    iVar14 = 0x32;
                    if (1 < (long)(puVar3 + (uVar12 - (long)puVar2) + 2)) {
                      local_3a = *puVar2 << 8 | *puVar2 >> 8;
                      *src = (uint8_t *)(puVar2 + 1);
                      iVar14 = 0;
                    }
                    bVar21 = true;
                    if (1 < (long)(puVar3 + (uVar12 - (long)puVar2) + 2)) {
                      iVar14 = 0x32;
                      bVar21 = true;
                      if (puVar3 + (uVar12 - (long)*src) + 2 < (uint8_t *)0x2) {
                        bVar6 = false;
                      }
                      else {
                        puVar5 = *src;
                        lVar13 = 0;
                        puVar17 = (uint8_t *)0x0;
                        do {
                          uVar19 = (long)puVar17 * 0x100;
                          *src = puVar5 + lVar13 + 1;
                          uVar20 = (ulong)puVar5[lVar13];
                          puVar17 = (uint8_t *)(uVar19 + uVar20);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 2);
                        bVar6 = false;
                        if (puVar17 <= puVar18 + (uVar12 - (long)puVar5) + -2) {
                          *src = puVar5 + (uVar19 | uVar20) + 2;
                          bVar6 = true;
                          bVar21 = false;
                          iVar14 = 0;
                        }
                      }
                      if ((bVar6) && (bVar21 = false, (short)local_3a < 0)) {
                        bVar21 = false;
                        decoded->kem = (ptls_hpke_kem_t *)0x0;
                        decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
                      }
                    }
                    iVar15 = iVar14;
                    if (bVar21) goto LAB_0011fa94;
                    puVar2 = (ushort *)*src;
                  }
                  bVar21 = (ushort *)(puVar3 + uVar12 + 2) != puVar2;
                  iVar15 = 0x32;
                  if (!bVar21) {
                    iVar15 = iVar14;
                  }
                }
              }
LAB_0011fa94:
              iVar8 = iVar15;
              if (!bVar21) {
                if (bVar21) {
                  return iVar14;
                }
                iVar8 = 0x32;
                if (*src == end) {
                  iVar8 = iVar15;
                }
              }
            }
            goto LAB_0011f8bd;
          }
          iVar8 = 0x32;
        }
      }
    }
  }
  name = (char *)0x0;
LAB_0011f8bd:
  free(name);
  return iVar8;
}

Assistant:

static int decode_one_ech_config(ptls_hpke_kem_t **kems, ptls_hpke_cipher_suite_t **ciphers,
                                 struct st_decoded_ech_config_t *decoded, const uint8_t **src, const uint8_t *const end)
{
    char *public_name_buf = NULL;
    int ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    if ((ret = ptls_decode8(&decoded->id, src, end)) != 0)
        goto Exit;
    uint16_t kem_id;
    if ((ret = ptls_decode16(&kem_id, src, end)) != 0)
        goto Exit;
    for (size_t i = 0; kems[i] != NULL; ++i) {
        if (kems[i]->id == kem_id) {
            decoded->kem = kems[i];
            break;
        }
    }
    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        decoded->public_key = ptls_iovec_init(*src, end - *src);
        *src = end;
    });
    ptls_decode_open_block(*src, end, 2, {
        do {
            uint16_t kdf_id;
            uint16_t aead_id;
            if ((ret = ptls_decode16(&kdf_id, src, end)) != 0)
                goto Exit;
            if ((ret = ptls_decode16(&aead_id, src, end)) != 0)
                goto Exit;
            if (decoded->cipher == NULL) {
                for (size_t i = 0; ciphers[i] != NULL; ++i) {
                    if (ciphers[i]->id.kdf == kdf_id && ciphers[i]->id.aead == aead_id) {
                        decoded->cipher = ciphers[i];
                        break;
                    }
                }
            }
        } while (*src != end);
    });
    if ((ret = ptls_decode8(&decoded->max_name_length, src, end)) != 0)
        goto Exit;

#define SKIP_DECODED()                                                                                                             \
    do {                                                                                                                           \
        decoded->kem = NULL;                                                                                                       \
        decoded->cipher = NULL;                                                                                                    \
    } while (0)

    /* Decode public_name. The specification requires clients to ignore (upon parsing ESNIConfigList) or reject (upon handshake)
     * public names that are not DNS names or IPv4 addresses. We ignore IPv4 and v6 addresses during parsing (IPv6 addresses never
     * looks like DNS names), and delegate the responsibility of rejecting non-DNS names to the certificate verify callback. */
    ptls_decode_open_block(*src, end, 1, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((public_name_buf = duplicate_as_str(*src, end - *src)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (ptls_server_name_is_ipaddr(public_name_buf)) {
            SKIP_DECODED();
        } else {
            decoded->public_name = ptls_iovec_init(*src, end - *src);
        }
        *src = end;
    });

    ptls_decode_block(*src, end, 2, {
        while (*src < end) {
            uint16_t type;
            if ((ret = ptls_decode16(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, { *src = end; });
            /* if a critital extension is found, indicate that the config cannot be used */
            if ((type & 0x8000) != 0)
                SKIP_DECODED();
        }
    });

#undef SKIP_DECODED

Exit:
    free(public_name_buf);
    return ret;
}